

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void CompoundFile::readData<short>(istream *stream,short *data,size_t bytes)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  char c;
  
  *data = 0;
  sVar2 = 2;
  if (bytes != 0) {
    sVar2 = bytes;
  }
  bVar1 = 0;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    std::istream::get((char *)stream);
    *data = *data | 0 << (bVar1 & 0x1f);
    bVar1 = bVar1 + 8;
  }
  return;
}

Assistant:

void readData( std::istream & stream, Type & data, size_t bytes = 0 )
{
	data = Type(0);
	if( bytes == 0 ) bytes = sizeof( Type );

	for( size_t i = 0; i < bytes; ++i )
	{
		char c = 0x00;
		stream.get( c );

		data |= (((Type) (unsigned char) c ) << 8*i);
	}
}